

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

t_pool_result * t_pool_next_result_locked(t_results_queue *q)

{
  t_pool_result *local_20;
  t_pool_result *last;
  t_pool_result *r;
  t_results_queue *q_local;
  
  local_20 = (t_pool_result *)0x0;
  for (last = q->result_head; (last != (t_pool_result *)0x0 && (last->serial != q->next_serial));
      last = last->next) {
    local_20 = last;
  }
  if (last != (t_pool_result *)0x0) {
    if (q->result_head == last) {
      q->result_head = last->next;
    }
    else {
      local_20->next = last->next;
    }
    if (q->result_tail == last) {
      q->result_tail = local_20;
    }
    if (q->result_head == (t_pool_result *)0x0) {
      q->result_tail = (t_pool_result *)0x0;
    }
    q->next_serial = q->next_serial + 1;
    q->queue_len = q->queue_len + -1;
  }
  return last;
}

Assistant:

static t_pool_result *t_pool_next_result_locked(t_results_queue *q) {
    t_pool_result *r, *last;

    for (last = NULL, r = q->result_head; r; last = r, r = r->next) {
	if (r->serial == q->next_serial)
	    break;
    }

    if (r) {
	if (q->result_head == r)
	    q->result_head = r->next;
	else
	    last->next = r->next;

	if (q->result_tail == r)
	    q->result_tail = last;

	if (!q->result_head)
	    q->result_tail = NULL;

	q->next_serial++;
	q->queue_len--;
    }

    return r;
}